

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O2

float __thiscall
Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Apple::Macintosh::Audio>,_false>::
get_ideal_clock_rate_in_range
          (LowpassBase<Outputs::Speaker::PullLowpass<Apple::Macintosh::Audio>,_false> *this,
          float minimum,float maximum)

{
  float fVar1;
  float fVar2;
  
  std::mutex::lock(&this->filter_parameters_mutex_);
  fVar1 = (this->filter_parameters_).input_cycles_per_second;
  fVar2 = (this->filter_parameters_).high_frequency_cutoff;
  if (0.0 < fVar2) {
    fVar2 = fVar2 * 3.0;
    if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) goto LAB_00281ff9;
  }
  if ((fVar1 < minimum) || (fVar2 = fVar1, maximum < fVar1)) {
    fVar2 = (float)(~-(uint)(fVar1 < minimum) & (uint)maximum |
                   (uint)minimum & -(uint)(fVar1 < minimum));
  }
LAB_00281ff9:
  pthread_mutex_unlock((pthread_mutex_t *)&this->filter_parameters_mutex_);
  return fVar2;
}

Assistant:

float get_ideal_clock_rate_in_range(float minimum, float maximum) final {
			std::lock_guard lock_guard(filter_parameters_mutex_);

			// Return twice the cut off, if applicable.
			if(	filter_parameters_.high_frequency_cutoff > 0.0f &&
				filter_parameters_.input_cycles_per_second >= filter_parameters_.high_frequency_cutoff * 3.0f &&
				filter_parameters_.input_cycles_per_second <= filter_parameters_.high_frequency_cutoff * 3.0f)
					return filter_parameters_.high_frequency_cutoff * 3.0f;

			// Return exactly the input rate if possible.
			if(	filter_parameters_.input_cycles_per_second >= minimum &&
				filter_parameters_.input_cycles_per_second <= maximum)
					return filter_parameters_.input_cycles_per_second;

			// If the input rate is lower, return the minimum...
			if(filter_parameters_.input_cycles_per_second < minimum)
				return minimum;

			// ... otherwise, return the maximum.
			return maximum;
		}